

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void stl_string_pointer_is_not_null(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual;
  Constraint *constraint;
  allocator local_11;
  
  actual = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)actual,"bob",&local_11);
  bob_pointer_abi_cxx11_ = actual;
  constraint = (Constraint *)create_not_null_constraint();
  cgreen::assert_that_<std::__cxx11::string*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x9f,"bob_pointer",actual,constraint);
  return;
}

Assistant:

Ensure(stl_string_pointer_is_not_null) {
    bob_pointer = new std::string("bob");

    assert_that(bob_pointer, is_non_null);
}